

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armci.c
# Opt level: O0

void PARMCI_GroupFence(ARMCI_Group *group)

{
  int *in_RDI;
  comex_group_t unaff_retaddr;
  int rc;
  int local_c;
  
  if (*in_RDI < 1) {
    local_c = comex_fence_all(unaff_retaddr);
  }
  else {
    local_c = comex_fence_all(unaff_retaddr);
  }
  if (local_c == 0) {
    return;
  }
  __assert_fail("COMEX_SUCCESS == rc",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/armci.c"
                ,0x10e,"void PARMCI_GroupFence(ARMCI_Group *)");
}

Assistant:

void PARMCI_GroupFence(ARMCI_Group *group)
{
  int rc;
  if (*group > 0) {
    rc = comex_fence_all(*group);
  } else {
    rc = comex_fence_all(COMEX_GROUP_WORLD);
  }
  assert(COMEX_SUCCESS == rc);
}